

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(XMLGrammarPoolImpl *this,MemoryManager *memMgr)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *this_00;
  XMLStringPool *this_01;
  MemoryManager *memMgr_local;
  XMLGrammarPoolImpl *this_local;
  
  XMLGrammarPool::XMLGrammarPool(&this->super_XMLGrammarPool,memMgr);
  (this->super_XMLGrammarPool)._vptr_XMLGrammarPool =
       (_func_int **)&PTR__XMLGrammarPoolImpl_0052efb0;
  this->fGrammarRegistry = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x0;
  this->fStringPool = (XMLStringPool *)0x0;
  this->fSynchronizedStringPool = (XMLSynchronizedStringPool *)0x0;
  this->fXSModel = (XSModel *)0x0;
  this->fLocked = false;
  this->fXSModelIsValid = false;
  this_00 = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x38,memMgr);
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_00,0x1d,true,memMgr);
  this->fGrammarRegistry = this_00;
  this_01 = (XMLStringPool *)XMemory::operator_new(0x28,memMgr);
  XMLStringPool::XMLStringPool(this_01,0x6d,memMgr);
  this->fStringPool = this_01;
  return;
}

Assistant:

XMLGrammarPoolImpl::XMLGrammarPoolImpl(MemoryManager* const memMgr)
:XMLGrammarPool(memMgr)
,fGrammarRegistry(0)
,fStringPool(0)
,fSynchronizedStringPool(0)
,fXSModel(0)
,fLocked(false)
,fXSModelIsValid(false)
{
    fGrammarRegistry = new (memMgr) RefHashTableOf<Grammar>(29, true, memMgr);
    fStringPool = new (memMgr) XMLStringPool(109, memMgr);
}